

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

ompt_interface_fn_t ompt_fn_lookup(char *s)

{
  int iVar1;
  char *in_RDI;
  ompt_get_num_devices_t ompt_get_num_devices_f;
  ompt_get_target_info_t ompt_get_target_info_f;
  ompt_get_proc_id_t ompt_get_proc_id_f;
  ompt_get_partition_place_nums_t ompt_get_partition_place_nums_f;
  ompt_get_place_num_t ompt_get_place_num_f;
  ompt_get_place_proc_ids_t ompt_get_place_proc_ids_f;
  ompt_get_num_places_t ompt_get_num_places_f;
  ompt_get_num_procs_t ompt_get_num_procs_f;
  ompt_finalize_tool_t ompt_finalize_tool_f;
  ompt_get_unique_id_t ompt_get_unique_id_f;
  ompt_get_thread_data_t ompt_get_thread_data_f;
  ompt_get_task_memory_t ompt_get_task_memory_f;
  ompt_get_task_info_t ompt_get_task_info_f;
  ompt_get_parallel_info_t ompt_get_parallel_info_f;
  ompt_get_state_t ompt_get_state_f;
  ompt_get_callback_t ompt_get_callback_f;
  ompt_set_callback_t ompt_set_callback_f;
  ompt_enumerate_mutex_impls_t ompt_enumerate_mutex_impls_f;
  ompt_enumerate_states_t ompt_enumerate_states_f;
  ompt_interface_fn_t local_8;
  
  iVar1 = strcmp(in_RDI,"ompt_enumerate_states");
  if (iVar1 == 0) {
    local_8 = ompt_enumerate_states;
  }
  else {
    iVar1 = strcmp(in_RDI,"ompt_enumerate_mutex_impls");
    if (iVar1 == 0) {
      local_8 = ompt_enumerate_mutex_impls;
    }
    else {
      iVar1 = strcmp(in_RDI,"ompt_set_callback");
      if (iVar1 == 0) {
        local_8 = ompt_set_callback;
      }
      else {
        iVar1 = strcmp(in_RDI,"ompt_get_callback");
        if (iVar1 == 0) {
          local_8 = ompt_get_callback;
        }
        else {
          iVar1 = strcmp(in_RDI,"ompt_get_state");
          if (iVar1 == 0) {
            local_8 = ompt_get_state;
          }
          else {
            iVar1 = strcmp(in_RDI,"ompt_get_parallel_info");
            if (iVar1 == 0) {
              local_8 = ompt_get_parallel_info;
            }
            else {
              iVar1 = strcmp(in_RDI,"ompt_get_task_info");
              if (iVar1 == 0) {
                local_8 = ompt_get_task_info;
              }
              else {
                iVar1 = strcmp(in_RDI,"ompt_get_task_memory");
                if (iVar1 == 0) {
                  local_8 = ompt_get_task_memory;
                }
                else {
                  iVar1 = strcmp(in_RDI,"ompt_get_thread_data");
                  if (iVar1 == 0) {
                    local_8 = ompt_get_thread_data;
                  }
                  else {
                    iVar1 = strcmp(in_RDI,"ompt_get_unique_id");
                    if (iVar1 == 0) {
                      local_8 = ompt_get_unique_id;
                    }
                    else {
                      iVar1 = strcmp(in_RDI,"ompt_finalize_tool");
                      if (iVar1 == 0) {
                        local_8 = ompt_finalize_tool;
                      }
                      else {
                        iVar1 = strcmp(in_RDI,"ompt_get_num_procs");
                        if (iVar1 == 0) {
                          local_8 = ompt_get_num_procs;
                        }
                        else {
                          iVar1 = strcmp(in_RDI,"ompt_get_num_places");
                          if (iVar1 == 0) {
                            local_8 = ompt_get_num_places;
                          }
                          else {
                            iVar1 = strcmp(in_RDI,"ompt_get_place_proc_ids");
                            if (iVar1 == 0) {
                              local_8 = ompt_get_place_proc_ids;
                            }
                            else {
                              iVar1 = strcmp(in_RDI,"ompt_get_place_num");
                              if (iVar1 == 0) {
                                local_8 = ompt_get_place_num;
                              }
                              else {
                                iVar1 = strcmp(in_RDI,"ompt_get_partition_place_nums");
                                if (iVar1 == 0) {
                                  local_8 = ompt_get_partition_place_nums;
                                }
                                else {
                                  iVar1 = strcmp(in_RDI,"ompt_get_proc_id");
                                  if (iVar1 == 0) {
                                    local_8 = ompt_get_proc_id;
                                  }
                                  else {
                                    iVar1 = strcmp(in_RDI,"ompt_get_target_info");
                                    if (iVar1 == 0) {
                                      local_8 = ompt_get_target_info;
                                    }
                                    else {
                                      iVar1 = strcmp(in_RDI,"ompt_get_num_devices");
                                      if (iVar1 == 0) {
                                        local_8 = ompt_get_num_devices;
                                      }
                                      else {
                                        local_8 = (ompt_interface_fn_t)0x0;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

static ompt_interface_fn_t ompt_fn_lookup(const char *s) {

#define ompt_interface_fn(fn)                                                  \
  fn##_t fn##_f = fn;                                                          \
  if (strcmp(s, #fn) == 0)                                                     \
    return (ompt_interface_fn_t)fn##_f;

  FOREACH_OMPT_INQUIRY_FN(ompt_interface_fn)

#undef ompt_interface_fn

  return (ompt_interface_fn_t)0;
}